

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::init
          (VertexFeedbackOverflowCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)5> *this_00;
  ShaderProgram *this_01;
  ProgramSources *pPVar6;
  TestError *this_02;
  NotSupportedError *this_03;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  vector<float,_std::allocator<float>_> initialBufferContents;
  ContextType local_298;
  ContextType local_294;
  string local_290 [32];
  value_type local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [40];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [184];
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  long lVar5;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar2) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x16b4);
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n");
  std::operator<<((ostream *)poVar1,
                  "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if ((anonymous_namespace)::VertexFeedbackOverflowCase::init()::arrayData == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::VertexFeedbackOverflowCase::init()::
                                 arrayData);
    if (iVar3 != 0) {
      init::arrayData[0].m_data[0] = _DAT_007f34f0;
      init::arrayData[0].m_data[1] = _UNK_007f34f4;
      init::arrayData[0].m_data[2] = _UNK_007f34f8;
      init::arrayData[0].m_data[3] = _UNK_007f34fc;
      init::arrayData[1].m_data[0] = _DAT_007f34f0;
      init::arrayData[1].m_data[1] = _UNK_007f34f4;
      init::arrayData[1].m_data[2] = _UNK_007f34f8;
      init::arrayData[1].m_data[3] = _UNK_007f34fc;
      init::arrayData[2].m_data[0] = _DAT_007f34f0;
      init::arrayData[2].m_data[1] = _UNK_007f34f4;
      init::arrayData[2].m_data[2] = _UNK_007f34f8;
      init::arrayData[2].m_data[3] = _UNK_007f34fc;
      init::arrayData[3].m_data[0] = _DAT_007f34f0;
      init::arrayData[3].m_data[1] = _UNK_007f34f4;
      init::arrayData[3].m_data[2] = _UNK_007f34f8;
      init::arrayData[3].m_data[3] = _UNK_007f34fc;
      __cxa_guard_release(&(anonymous_namespace)::VertexFeedbackOverflowCase::init()::arrayData);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  this_00 = (TypedObjectWrapper<(glu::ObjectType)5> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (this_00,((this->super_TestCase).m_context)->m_renderCtx);
  this->m_vao = this_00;
  (**(code **)(lVar5 + 0xd8))((this_00->super_ObjectWrapper).m_object);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"set up vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16d2);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_elementBuf);
    (**(code **)(lVar5 + 0x40))(0x8893,this->m_elementBuf);
    (**(code **)(lVar5 + 0x150))(0x8893,0xc,init::elementData,0x88e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"gen buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x16d9);
  }
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_arrayBuf);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lVar5 + 0x150))(0x8892,0x40,init::arrayData,0x88e4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16df);
  local_1a8._0_4_ = 0xbf800000;
  std::vector<float,_std::allocator<float>_>::vector
            (&initialBufferContents,0x14,(value_type_conflict4 *)local_1a8,
             (allocator_type *)local_210);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Filling feeback buffer with dummy value (-1.0).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_feedbackBuf);
  (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_feedbackBuf);
  (**(code **)(lVar5 + 0x150))
            (0x8c8e,(long)((int)initialBufferContents.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (int)initialBufferContents.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start) & 0xfffffffffffffffc,
             initialBufferContents.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x16ea);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&initialBufferContents.super__Vector_base<float,_std::allocator<float>_>);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_1a8._176_8_ = (pointer)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  uStack_e8 = 0;
  uStack_e7 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_2c1);
  local_294.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_1c8,&local_1e8,&local_294);
  glu::VertexSource::VertexSource((VertexSource *)&initialBufferContents,&local_1c8);
  pPVar6 = glu::ProgramSources::operator<<
                     ((ProgramSources *)local_1a8,(ShaderSource *)&initialBufferContents);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_2c2);
  local_298.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_230,&local_250,&local_298);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_210,&local_230);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_210);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"gl_Position",&local_2c3);
  std::__cxx11::string::string((string *)&local_270,local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pPVar6->transformFeedbackVaryings,&local_270);
  pPVar6->transformFeedbackBufferMode = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar6);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string((string *)(local_210 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string
            ((string *)
             &initialBufferContents.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  this->m_program = this_01;
  if ((this_01->m_program).m_info.linkOk != false) {
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_01);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"could not build program",(allocator<char> *)&initialBufferContents
            );
  tcu::TestError::TestError(this_02,(string *)local_1a8);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexFeedbackOverflowCase::init (void)
{
	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// log what test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing GL_EXT_geometry_shader transform feedback overflow behavior.\n"
		<< "Capturing vertex shader varying, rendering 2 triangles. Allocating feedback buffer for 5 vertices."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		static const deUint16	elementData[] =
		{
			0, 1, 2,
			0, 1, 2,
		};
		static const tcu::Vec4	arrayData[] =
		{
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();

		m_vao = new glu::VertexArray(m_context.getRenderContext());
		gl.bindVertexArray(**m_vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set up vao");

		if (m_method == METHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_elementBuf);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuf);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(elementData), &elementData[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(arrayData), &arrayData[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		{
			const int					feedbackCount			= 5 * 4; // 5x vec4
			const std::vector<float>	initialBufferContents	(feedbackCount, -1.0f);

			m_testCtx.getLog() << tcu::TestLog::Message << "Filling feeback buffer with dummy value (-1.0)." << tcu::TestLog::EndMessage;

			gl.genBuffers(1, &m_feedbackBuf);
			gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_feedbackBuf);
			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(float) * initialBufferContents.size()), &initialBufferContents[0], GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");
		}

		m_program = genProgram();

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("could not build program");
		}
	}
}